

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# DataFieldInfo.h
# Opt level: O2

void __thiscall
ser::DataFieldInfo::Init
          (DataFieldInfo *this,string *name,string *type,int bytesPerElement,int rank,int iSize,
          int jSize,int kSize,int lSize,int iMinusHalo,int iPlusHalo,int jMinusHalo,int jPlusHalo,
          int kMinusHalo,int kPlusHalo,int lMinusHalo,int lPlusHalo)

{
  std::__cxx11::string::_M_assign((string *)this);
  std::__cxx11::string::_M_assign((string *)&this->type_);
  this->bytesPerElement_ = bytesPerElement;
  this->rank_ = rank;
  this->iSize_ = iSize;
  this->jSize_ = jSize;
  this->kSize_ = kSize;
  this->lSize_ = lSize;
  this->iMinusHalo_ = iMinusHalo;
  this->iPlusHalo_ = iPlusHalo;
  this->jMinusHalo_ = jMinusHalo;
  this->jPlusHalo_ = jPlusHalo;
  this->kMinusHalo_ = kMinusHalo;
  this->kPlusHalo_ = kPlusHalo;
  this->lMinusHalo_ = lMinusHalo;
  this->lPlusHalo_ = lPlusHalo;
  return;
}

Assistant:

void Init(std::string name, std::string type, int bytesPerElement, int rank,
                  int iSize, int jSize, int kSize, int lSize,
                  int iMinusHalo, int iPlusHalo, int jMinusHalo, int jPlusHalo,
                  int kMinusHalo, int kPlusHalo, int lMinusHalo, int lPlusHalo
                  )
        {
            name_ = name;
            type_ = type;
            bytesPerElement_ = bytesPerElement;
            rank_ = rank;

            iSize_ = iSize;
            jSize_ = jSize;
            kSize_ = kSize;
            lSize_ = lSize;

            iMinusHalo_ = iMinusHalo;
            iPlusHalo_  = iPlusHalo;
            jMinusHalo_ = jMinusHalo;
            jPlusHalo_  = jPlusHalo;
            kMinusHalo_ = kMinusHalo;
            kPlusHalo_  = kPlusHalo;
            lMinusHalo_ = lMinusHalo;
            lPlusHalo_  = lPlusHalo;
        }